

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata_cache.c
# Opt level: O1

edata_t * duckdb_je_edata_cache_get(tsdn_t *tsdn,edata_cache_t *edata_cache)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  int iVar3;
  edata_t *peVar4;
  
  __mutex = (pthread_mutex_t *)((long)&(edata_cache->mtx).field_0 + 0x48);
  iVar3 = pthread_mutex_trylock(__mutex);
  if (iVar3 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&edata_cache->mtx);
    (edata_cache->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(edata_cache->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((edata_cache->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (edata_cache->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(edata_cache->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  peVar4 = duckdb_je_edata_avail_first(&edata_cache->avail);
  if (peVar4 != (edata_t *)0x0) {
    duckdb_je_edata_avail_remove(&edata_cache->avail,peVar4);
    (edata_cache->count).repr = (edata_cache->count).repr - 1;
    (edata_cache->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(__mutex);
    return peVar4;
  }
  (edata_cache->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  peVar4 = duckdb_je_base_alloc_edata(tsdn,edata_cache->base);
  return peVar4;
}

Assistant:

edata_t *
edata_cache_get(tsdn_t *tsdn, edata_cache_t *edata_cache) {
	malloc_mutex_lock(tsdn, &edata_cache->mtx);
	edata_t *edata = edata_avail_first(&edata_cache->avail);
	if (edata == NULL) {
		malloc_mutex_unlock(tsdn, &edata_cache->mtx);
		return base_alloc_edata(tsdn, edata_cache->base);
	}
	edata_avail_remove(&edata_cache->avail, edata);
	atomic_load_sub_store_zu(&edata_cache->count, 1);
	malloc_mutex_unlock(tsdn, &edata_cache->mtx);
	return edata;
}